

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

back_insert_iterator<fmt::v10::detail::buffer<char>_>
fmt::v10::detail::write<char,std::back_insert_iterator<fmt::v10::detail::buffer<char>>>
          (back_insert_iterator<fmt::v10::detail::buffer<char>_> out,char *value)

{
  basic_string_view<char> value_00;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> bVar1;
  size_t in_RSI;
  char *local_38;
  char *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffe8;
  
  if (in_RSI != 0) {
    bVar1.container = (buffer<char> *)&stack0xffffffffffffffc0;
    local_38 = (char *)std::char_traits<char>::length((char_type *)0x201dff);
    value_00.size_ = in_RSI;
    value_00.data_ = in_stack_ffffffffffffffe8;
    bVar1 = write<char,std::back_insert_iterator<fmt::v10::detail::buffer<char>>>(bVar1,value_00);
    return (back_insert_iterator<fmt::v10::detail::buffer<char>_>)bVar1.container;
  }
  throw_format_error(in_stack_ffffffffffffffd0);
}

Assistant:

FMT_CONSTEXPR_CHAR_TRAITS auto write(OutputIt out, const Char* value)
    -> OutputIt {
  if (value) return write(out, basic_string_view<Char>(value));
  throw_format_error("string pointer is null");
  return out;
}